

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# klass_register.cpp
# Opt level: O3

HT_EventKlassId __thiscall
HawkTracer::parser::KlassRegister::get_klass_id(KlassRegister *this,string *name)

{
  _Hash_node_base *p_Var1;
  undefined1 *puVar2;
  int iVar3;
  undefined8 uVar4;
  HT_EventKlassId HVar5;
  __node_base *p_Var6;
  bool bVar7;
  pthread_mutex_t *local_58;
  undefined1 *local_50;
  size_t local_48;
  undefined1 local_40 [16];
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar3 != 0) {
    uVar4 = std::__throw_system_error(iVar3);
    pthread_mutex_unlock(local_58);
    _Unwind_Resume(uVar4);
  }
  p_Var6 = &(this->_register)._M_h._M_before_begin;
  do {
    p_Var6 = p_Var6->_M_nxt;
    if (p_Var6 == (__node_base *)0x0) {
      HVar5 = 0xffffffff;
      goto LAB_0010ef4d;
    }
    p_Var1 = (*(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var6 + 2))->_M_max_load_factor)[8].
             _M_nxt;
    local_50 = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,p_Var1,
               (long)&p_Var1->_M_nxt +
               (long)&((*(_Hash_node_base **)
                         &((_Prime_rehash_policy *)(p_Var6 + 2))->_M_max_load_factor)[9]._M_nxt)->
                      _M_nxt);
    puVar2 = local_50;
    if (local_48 == name->_M_string_length) {
      if (local_48 == 0) {
        bVar7 = true;
      }
      else {
        iVar3 = bcmp(local_50,(name->_M_dataplus)._M_p,local_48);
        bVar7 = iVar3 == 0;
      }
    }
    else {
      bVar7 = false;
    }
    if (puVar2 != local_40) {
      operator_delete(puVar2);
    }
  } while (!bVar7);
  HVar5 = *(HT_EventKlassId *)
           &(*(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var6 + 2))->_M_max_load_factor)[0xc].
            _M_nxt;
LAB_0010ef4d:
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return HVar5;
}

Assistant:

HT_EventKlassId KlassRegister::get_klass_id(const std::string& name) const
{
    lock_guard l(_register_mtx);
    for (const auto& klass : _register)
    {
        if (klass.second->get_name() == name)
        {
            return klass.second->get_id();
        }
    }

    return HT_INVALID_KLASS_ID;
}